

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::get_optimal_tile_mnk(int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int *in_R8;
  int *in_R9;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_stack_00000008;
  int nn_N;
  int tile_size_2;
  int nn_K;
  int tile_size_1;
  int nn_M;
  int tile_size;
  size_t l2_cache_size;
  float local_9c;
  float local_94;
  float local_80;
  int local_7c;
  int local_78;
  int local_74 [3];
  int local_68;
  int local_64;
  int local_60 [3];
  int local_54 [3];
  int local_48;
  int local_44;
  int local_40;
  int local_3c [3];
  ulong local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  int local_c;
  int local_8;
  int local_4;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  iVar1 = get_cpu_level2_cache_size();
  local_30 = (ulong)iVar1;
  if (in_stack_00000008 == 0) {
    in_stack_00000008 = get_physical_big_cpu_count();
  }
  local_80 = (float)local_30;
  auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar5._0_4_ = (local_80 / 4.0) / 3.0;
  dVar4 = std::sqrt(auVar5._0_8_);
  local_3c[2] = (int)SUB84(dVar4,0);
  local_3c[1] = 8;
  local_3c[0] = local_3c[2] / 8 << 3;
  piVar2 = std::max<int>(local_3c + 1,local_3c);
  *local_18 = *piVar2;
  local_40 = get_physical_cpu_count();
  piVar2 = std::min<int>(&stack0x00000008,&local_40);
  *local_18 = *piVar2 * *local_18;
  local_44 = (local_4 + *local_18 + -1) / *local_18;
  local_48 = ((local_4 + local_44 + -1) / local_44 + 7) / 8 << 3;
  piVar3 = std::min<int>(local_18,&local_48);
  piVar2 = local_18;
  *local_18 = *piVar3;
  if (1 < in_stack_00000008) {
    local_54[1] = 1;
    local_54[0] = *local_18 / in_stack_00000008;
    piVar3 = std::max<int>(local_54 + 1,local_54);
    local_54[2] = (*piVar3 + 7) / 8 << 3;
    piVar2 = std::min<int>(piVar2,local_54 + 2);
    *local_18 = *piVar2;
  }
  local_94 = (float)local_30;
  auVar6._0_4_ = local_94 / 4.0;
  auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
  dVar4 = std::sqrt(auVar6._0_8_);
  local_60[2] = (int)(SUB84(dVar4,0) - (float)*local_18);
  local_60[1] = 8;
  local_60[0] = local_60[2] / 8 << 3;
  piVar2 = std::max<int>(local_60 + 1,local_60);
  *local_28 = *piVar2;
  local_64 = (local_c + *local_28 + -1) / *local_28;
  local_68 = ((local_c + local_64 + -1) / local_64 + 7) / 8 << 3;
  piVar2 = std::min<int>(local_28,&local_68);
  *local_28 = *piVar2;
  if (0 < local_8) {
    local_9c = (float)local_30;
    local_74[2] = (int)((local_9c / 4.0 - (float)(*local_18 * *local_28)) /
                       (float)(*local_18 + *local_28));
    local_74[1] = 4;
    local_74[0] = local_74[2] / 4 << 2;
    piVar2 = std::max<int>(local_74 + 1,local_74);
    *local_20 = *piVar2;
    local_78 = (local_8 + *local_20 + -1) / *local_20;
    local_7c = ((local_8 + local_78 + -1) / local_78 + 3) / 4 << 2;
    piVar2 = std::min<int>(local_20,&local_7c);
    *local_20 = *piVar2;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size = get_cpu_level2_cache_size();

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve M
    {
        int tile_size = (int)sqrt((float)l2_cache_size / sizeof(float) / 3);

#if __AVX512F__
        TILE_M = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_M = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, tile_size / 4 * 4);
#else
        TILE_M = std::max(2, tile_size / 2 * 2);
#endif

        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    // solve K
    {
        int tile_size = (int)(sqrt((float)l2_cache_size / sizeof(float)) - TILE_M);

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(4, tile_size / 4 * 4);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int tile_size = (int)(((float)l2_cache_size / sizeof(float) - TILE_M * TILE_K) / (TILE_M + TILE_K));

#if __AVX512F__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }
}